

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int array_run_container_xor(array_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  _Bool _Var1;
  int iVar2;
  run_container_t *dst_00;
  run_container_t *prVar3;
  array_container_t *src_1_00;
  bitset_container_t *src_1_01;
  long lVar4;
  long lVar5;
  uint8_t typecode_after;
  byte local_29;
  
  if (src_1->cardinality < 0x20) {
    dst_00 = (run_container_t *)calloc(1,0x10);
    array_run_container_lazy_xor(src_1,src_2,dst_00);
    prVar3 = (run_container_t *)convert_run_to_efficient_container(dst_00,&local_29);
    if (prVar3 != dst_00) {
      run_container_free(dst_00);
    }
    *dst = prVar3;
    return (uint)local_29;
  }
  lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar4 + 4) & 0x20) == 0) {
    iVar2 = src_2->n_runs;
    lVar4 = (long)iVar2;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        iVar2 = iVar2 + (uint)src_2->runs[lVar5].length;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
      goto LAB_0010fd79;
    }
  }
  else {
    iVar2 = _avx2_run_container_cardinality(src_2);
LAB_0010fd79:
    if (0x1000 < iVar2) {
      src_1_01 = bitset_container_from_run(src_2);
      _Var1 = bitset_array_container_ixor(src_1_01,src_1,dst);
      goto LAB_0010fdc2;
    }
  }
  src_1_00 = array_container_from_run(src_2);
  _Var1 = array_array_container_xor(src_1_00,src_1,dst);
  array_container_free(src_1_00);
LAB_0010fdc2:
  return 2 - (uint)_Var1;
}

Assistant:

int array_run_container_xor(
    const array_container_t *src_1, const run_container_t *src_2,
    container_t **dst
){
    // semi following Java XOR implementation as of May 2016
    // the C OR implementation works quite differently and can return a run
    // container
    // TODO could optimize for full run containers.

    // use of lazy following Java impl.
    const int arbitrary_threshold = 32;
    if (src_1->cardinality < arbitrary_threshold) {
        run_container_t *ans = run_container_create();
        array_run_container_lazy_xor(src_1, src_2, ans);  // keeps runs.
        uint8_t typecode_after;
        *dst =
            convert_run_to_efficient_container_and_free(ans, &typecode_after);
        return typecode_after;
    }

    int card = run_container_cardinality(src_2);
    if (card <= DEFAULT_MAX_SIZE) {
        // Java implementation works with the array, xoring the run elements via
        // iterator
        array_container_t *temp = array_container_from_run(src_2);
        bool ret_is_bitset = array_array_container_xor(temp, src_1, dst);
        array_container_free(temp);
        return ret_is_bitset ? BITSET_CONTAINER_TYPE
                             : ARRAY_CONTAINER_TYPE;

    } else {  // guess that it will end up as a bitset
        bitset_container_t *result = bitset_container_from_run(src_2);
        bool is_bitset = bitset_array_container_ixor(result, src_1, dst);
        // any necessary type conversion has been done by the ixor
        int retval = (is_bitset ? BITSET_CONTAINER_TYPE
                                : ARRAY_CONTAINER_TYPE);
        return retval;
    }
}